

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.cpp
# Opt level: O0

void sigill_handler(int code,siginfo_t *siginfo,void *context)

{
  int iVar1;
  native_context_t *ucontext;
  EXCEPTION_POINTERS pointers;
  EXCEPTION_RECORD record;
  void *context_local;
  siginfo_t *siginfo_local;
  int code_local;
  
  iVar1 = Volatile::operator_cast_to_int((Volatile *)&init_count);
  if (0 < iVar1) {
    pointers.ContextRecord._0_4_ =
         CONTEXTGetExceptionCodeForSignal(siginfo,(native_context_t *)context);
    pointers.ContextRecord._4_4_ = 0x100;
    GetNativeContextPC((native_context_t *)context);
    ucontext = (native_context_t *)&pointers.ContextRecord;
    common_signal_handler((PEXCEPTION_POINTERS)&ucontext,code,(native_context_t *)context);
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  if (g_previous_sigill.__sigaction_handler.sa_handler == (__sighandler_t)0x0) {
    restore_signal(code,&g_previous_sigill);
  }
  else {
    (*g_previous_sigill.__sigaction_handler.sa_handler)(code);
  }
  return;
}

Assistant:

static void sigill_handler(int code, siginfo_t *siginfo, void *context)
{
    if (PALIsInitialized())
    {
        EXCEPTION_RECORD record;
        EXCEPTION_POINTERS pointers;
        native_context_t *ucontext;

        ucontext = (native_context_t *)context;

        record.ExceptionCode = CONTEXTGetExceptionCodeForSignal(siginfo, ucontext);
        record.ExceptionFlags = EXCEPTION_IS_SIGNAL;
        record.ExceptionRecord = NULL;
        record.ExceptionAddress = GetNativeContextPC(ucontext);
        record.NumberParameters = 0;

        pointers.ExceptionRecord = &record;

        common_signal_handler(&pointers, code, ucontext);
    }

    TRACE("SIGILL signal was unhandled; chaining to previous sigaction\n");

    if (g_previous_sigill.sa_sigaction != NULL)
    {
        g_previous_sigill.sa_sigaction(code, siginfo, context);
    }
    else
    {
        // Restore the original or default handler and restart h/w exception
        restore_signal(code, &g_previous_sigill);
    }
}